

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

bool __thiscall doublechecked::Roaring64Map::isSubset(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_const_iterator<unsigned_long> __last1;
  byte bVar1;
  uint uVar2;
  iterator __first2;
  iterator __last2;
  iterator result;
  iterator expression;
  _Rb_tree_const_iterator<unsigned_long> in_RSI;
  Roaring64Map *in_RDI;
  bool ans;
  int line;
  undefined4 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = roaring::Roaring64Map::isSubset(in_RDI,(Roaring64Map *)in_RSI._M_node);
  uVar2 = (uint)bVar1;
  __first2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_RDI);
  __last2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)in_RDI);
  result = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_RDI);
  expression = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_RDI);
  line = (int)((ulong)in_RDI >> 0x20);
  __last1._M_node._7_1_ = bVar1;
  __last1._M_node._0_7_ = in_stack_ffffffffffffffe8;
  std::
  includes<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>>
            (in_RSI,__last1,(_Rb_tree_const_iterator<unsigned_long>)__first2._M_node,
             (_Rb_tree_const_iterator<unsigned_long>)__last2._M_node);
  _assert_true((unsigned_long)result._M_node,(char *)expression._M_node,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),line);
  return (bool)(bVar1 & 1);
}

Assistant:

bool isSubset(const Roaring64Map &r) const {  // is `this` subset of `r`?
        bool ans = plain.isSubset(r.plain);
        assert_true(ans == std::includes(
                               r.check.begin(),
                               r.check.end(),  // containing range
                               check.begin(),
                               check.end()  // range to test for containment
                               ));
        return ans;
    }